

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkFromFraig(Fraig_Man_t *pMan,Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  Abc_Ntk_t *pNtk_00;
  Fraig_Node_t *pFVar2;
  Fraig_Node_t *pData;
  ProgressBar *p;
  Vec_Ptr_t *pVVar3;
  Fraig_Node_t **ppFVar4;
  Abc_Obj_t *pFanin;
  long lVar5;
  
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
  pVVar3 = pNtk->vCis;
  if (0 < pVVar3->nSize) {
    lVar5 = 0;
    do {
      pvVar1 = pVVar3->pArray[lVar5];
      pFVar2 = Fraig_ManReadIthVar(pMan,(int)lVar5);
      Fraig_NodeSetData1(pFVar2,*(Fraig_Node_t **)((long)pvVar1 + 0x40));
      lVar5 = lVar5 + 1;
      pVVar3 = pNtk->vCis;
    } while (lVar5 < pVVar3->nSize);
  }
  pFVar2 = Fraig_ManReadConst1(pMan);
  pData = (Fraig_Node_t *)Abc_AigConst1(pNtk_00);
  Fraig_NodeSetData1(pFVar2,pData);
  p = Extra_ProgressBarStart(_stdout,pNtk->vCos->nSize);
  pVVar3 = pNtk->vCos;
  if (0 < pVVar3->nSize) {
    lVar5 = 0;
    do {
      pvVar1 = pVVar3->pArray[lVar5];
      if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar5)) {
        Extra_ProgressBarUpdate_int(p,(int)lVar5,(char *)0x0);
      }
      ppFVar4 = Fraig_ManReadOutputs(pMan);
      pFanin = Abc_NodeFromFraig_rec(pNtk_00,ppFVar4[lVar5]);
      Abc_ObjAddFanin(*(Abc_Obj_t **)((long)pvVar1 + 0x40),pFanin);
      lVar5 = lVar5 + 1;
      pVVar3 = pNtk->vCos;
    } while (lVar5 < pVVar3->nSize);
  }
  Extra_ProgressBarStop(p);
  Abc_NtkReassignIds(pNtk_00);
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkFromFraig( Fraig_Man_t * pMan, Abc_Ntk_t * pNtk )
{
    ProgressBar * pProgress;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pNode, * pNodeNew;
    int i;
    // create the new network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // make the mapper point to the new network
    Abc_NtkForEachCi( pNtk, pNode, i )
        Fraig_NodeSetData1( Fraig_ManReadIthVar(pMan, i), (Fraig_Node_t *)pNode->pCopy );
    // set the constant node
    Fraig_NodeSetData1( Fraig_ManReadConst1(pMan), (Fraig_Node_t *)Abc_AigConst1(pNtkNew) );
    // process the nodes in topological order
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        pNodeNew = Abc_NodeFromFraig_rec( pNtkNew, Fraig_ManReadOutputs(pMan)[i] );
        Abc_ObjAddFanin( pNode->pCopy, pNodeNew );
    }
    Extra_ProgressBarStop( pProgress );
    Abc_NtkReassignIds( pNtkNew );
    return pNtkNew;
}